

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O3

void pnga_gop(Integer type,void *x,Integer n,char *op)

{
  Integer p_grp;
  int n_00;
  
  p_grp = pnga_pgroup_get_default();
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (0 < p_grp) {
    pnga_pgroup_gop(p_grp,type,x,n,op);
    return;
  }
  n_00 = (int)n;
  switch(type) {
  case 0x3e9:
    armci_msg_igop((int *)x,n_00,op);
    return;
  case 0x3ea:
    armci_msg_lgop((long *)x,n_00,op);
    return;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    n = (Integer)(uint)(n_00 * 2);
  case 0x3eb:
    armci_msg_fgop((float *)x,(int)n,op);
    return;
  case 0x3ef:
    n = (Integer)(uint)(n_00 * 2);
  case 0x3ec:
    armci_msg_dgop((double *)x,(int)n,op);
    return;
  case 0x3f8:
    armci_msg_llgop((longlong *)x,n_00,op);
    return;
  }
}

Assistant:

void pnga_gop(Integer type, void *x, Integer n, char *op)
{
    Integer p_grp = pnga_pgroup_get_default();

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
        pnga_pgroup_gop(p_grp, type, x, n, op);
    } else {
#if defined(MSG_COMMS_MPI)
        switch (type){
            case C_INT:
                armci_msg_igop((int*)x, n, op);
                break;
            case C_LONG:
                armci_msg_lgop((long*)x, n, op);
                break;
            case C_LONGLONG:
                armci_msg_llgop((long long*)x, n, op);
                break;
            case C_FLOAT:
                armci_msg_fgop((float*)x, n, op);
                break;
            case C_DBL:
                armci_msg_dgop((double*)x, n, op);
                break;
            case C_SCPL:
                armci_msg_fgop((float*)x, 2*n, op);
                break;
            case C_DCPL:
                armci_msg_dgop((double*)x, 2*n, op);
                break;
            default:
                pnga_error(" wrong data type ",type);
        }
#else
        switch (type){
            case C_INT:
                pnga_error("Operation not defined for system",0);
                break;
            case C_LONG:
                tcg_igop(GA_TYPE_GOP, x, n, op);
                break;
            case C_LONGLONG:
                pnga_error("Operation not defined for system",0);
                break;
            case C_FLOAT:
                pnga_error("Operation not defined for system",0);
                break;
            case C_DBL:
                tcg_dgop(GA_TYPE_GOP, x, n, op);
                break;
            case C_SCPL:
                pnga_error("Operation not defined for system",0);
                break;
            case C_DCPL:
                pnga_error("Operation not defined for system",0);
                break;
            default:
                pnga_error(" wrong data type ",type);
        }
#endif
    }
}